

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<7,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  long lVar1;
  float fVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  undefined1 auVar5 [16];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar2 = evalCtx->in[0].m_data[0];
    fVar8 = evalCtx->in[0].m_data[1];
    fVar7 = evalCtx->in[1].m_data[0];
    uVar3 = (ulong)(uint)evalCtx->in[1].m_data[1];
  }
  else {
    uVar3 = 0;
    fVar7 = 1.0;
    fVar8 = -0.2;
    fVar2 = -0.1;
  }
  fVar9 = fVar2 * (float)uVar3 - fVar7 * fVar8;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar3;
  auVar5._12_4_ = 0x80000000;
  auVar4._8_8_ = auVar5._8_8_;
  auVar4._0_8_ = CONCAT44(fVar7,(float)uVar3) ^ 0x8000000000000000;
  auVar6._4_4_ = fVar9;
  auVar6._0_4_ = fVar9;
  auVar6._8_8_ = 0;
  auVar6 = divps(auVar4,auVar6);
  local_28 = auVar6._0_8_;
  local_20 = fVar2 / fVar9 - fVar8 / fVar9;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_30[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(inverse(in0));
	}